

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9SplitProve(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint local_48;
  uint local_44;
  int fSilent;
  int fVeryVerbose;
  int fVerbose;
  int LookAhead;
  int nIterMax;
  int nTimeOut;
  int nProcs;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  nIterMax = 1;
  LookAhead = 10;
  fVerbose = 0;
  fVeryVerbose = 1;
  fSilent = 0;
  local_44 = 0;
  local_48 = 0;
  Extra_UtilGetoptReset();
LAB_002bbafb:
  do {
    iVar1 = Extra_UtilGetopt(argc,argv,"PTILsvwh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9SplitProve(): There is no AIG.\n");
        return 1;
      }
      iVar1 = Gia_ManRegNum(pAbc->pGia);
      if (0 < iVar1) {
        Abc_Print(-1,"Abc_CommandAbc9SplitProve(): The problem is sequential.\n");
        return 1;
      }
      iVar1 = Cec_GiaSplitTest(pAbc->pGia,nIterMax,LookAhead,fVerbose,fVeryVerbose,fSilent,local_44,
                               local_48);
      pAbc->Status = iVar1;
      pAbc->pCex = pAbc->pGia->pCexComb;
      pAbc->pGia->pCexComb = (Abc_Cex_t *)0x0;
      return 0;
    }
    switch(iVar1) {
    case 0x49:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
        goto LAB_002bbdfc;
      }
      fVerbose = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (fVerbose < 0) goto LAB_002bbdfc;
      goto LAB_002bbafb;
    default:
      goto LAB_002bbdfc;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
        goto LAB_002bbdfc;
      }
      fVeryVerbose = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if ((fVeryVerbose < 1) || (100 < fVeryVerbose)) {
        Abc_Print(-1,"Look-ahead value (\"-L <num>\") should be between 1 and 100.\n",
                  (ulong)(uint)fVeryVerbose);
        goto LAB_002bbdfc;
      }
      goto LAB_002bbafb;
    case 0x50:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by a positive integer.\n");
        goto LAB_002bbdfc;
      }
      nIterMax = atoi(argv[globalUtilOptind]);
      iVar1 = nIterMax;
      break;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by a positive integer.\n");
        goto LAB_002bbdfc;
      }
      LookAhead = atoi(argv[globalUtilOptind]);
      iVar1 = LookAhead;
      break;
    case 0x68:
      goto LAB_002bbdfc;
    case 0x73:
      local_48 = local_48 ^ 1;
      goto LAB_002bbafb;
    case 0x76:
      fSilent = fSilent ^ 1;
      goto LAB_002bbafb;
    case 0x77:
      local_44 = local_44 ^ 1;
      goto LAB_002bbafb;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar1 < 1) {
LAB_002bbdfc:
      Abc_Print(-2,"usage: &splitprove [-PTIL num] [-svwh]\n");
      Abc_Print(-2,"\t         proves CEC problem by case-splitting\n");
      Abc_Print(-2,"\t-P num : the number of concurrent processes [default = %d]\n",
                (ulong)(uint)nIterMax);
      Abc_Print(-2,"\t-T num : runtime limit in seconds per subproblem [default = %d]\n",
                (ulong)(uint)LookAhead);
      Abc_Print(-2,"\t-I num : the max number of iterations (0 = infinity) [default = %d]\n",
                (ulong)(uint)fVerbose);
      Abc_Print(-2,"\t-L num : maximum look-ahead during cofactoring [default = %d]\n",
                (ulong)(uint)fVeryVerbose);
      pcVar2 = "no";
      if (local_48 != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-s     : enable silent computation (no reporting) [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (fSilent != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
      pcVar2 = "no";
      if (local_44 != 0) {
        pcVar2 = "yes";
      }
      Abc_Print(-2,"\t-w     : toggle printing more verbose information [default = %s]\n",pcVar2);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9SplitProve( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern int Cec_GiaSplitTest( Gia_Man_t * p, int nProcs, int nTimeOut, int nIterMax, int LookAhead, int fVerbose, int fVeryVerbose, int fSilent );
    int c, nProcs = 1, nTimeOut = 10, nIterMax = 0, LookAhead = 1, fVerbose = 0, fVeryVerbose = 0, fSilent = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "PTILsvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nProcs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nProcs <= 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeOut <= 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            nIterMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nIterMax < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            LookAhead = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( LookAhead <= 0 || LookAhead > 100 )
            {
                Abc_Print( -1, "Look-ahead value (\"-L <num>\") should be between 1 and 100.\n", LookAhead );
                goto usage;
            }
            break;
        case 's':
            fSilent ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'w':
            fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9SplitProve(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) > 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9SplitProve(): The problem is sequential.\n" );
        return 1;
    }
    pAbc->Status = Cec_GiaSplitTest( pAbc->pGia, nProcs, nTimeOut, nIterMax, LookAhead, fVerbose, fVeryVerbose, fSilent );
    pAbc->pCex = pAbc->pGia->pCexComb;  pAbc->pGia->pCexComb = NULL;
    return 0;

usage:
    Abc_Print( -2, "usage: &splitprove [-PTIL num] [-svwh]\n" );
    Abc_Print( -2, "\t         proves CEC problem by case-splitting\n" );
    Abc_Print( -2, "\t-P num : the number of concurrent processes [default = %d]\n",          nProcs );
    Abc_Print( -2, "\t-T num : runtime limit in seconds per subproblem [default = %d]\n",     nTimeOut );
    Abc_Print( -2, "\t-I num : the max number of iterations (0 = infinity) [default = %d]\n", nIterMax );
    Abc_Print( -2, "\t-L num : maximum look-ahead during cofactoring [default = %d]\n",       LookAhead );
    Abc_Print( -2, "\t-s     : enable silent computation (no reporting) [default = %s]\n",    fSilent? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",         fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-w     : toggle printing more verbose information [default = %s]\n",    fVeryVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}